

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int ftxui::wchar_width(wchar_t ucs)

{
  int iVar1;
  wchar_t ucs_local;
  
  iVar1 = anon_unknown.dwarf_20148::codepoint_width(ucs);
  return iVar1;
}

Assistant:

int wchar_width(wchar_t ucs) {
  return codepoint_width(uint32_t(ucs));
}